

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.cpp
# Opt level: O0

string * __thiscall
Assimp::LWSImporter::FindLWOFile(string *__return_storage_ptr__,LWSImporter *this,string *in)

{
  char __lhs;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  allocator local_189;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  allocator local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 local_100 [8];
  string test;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  allocator local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string tmp;
  string *in_local;
  LWSImporter *this_local;
  
  tmp.field_2._8_8_ = in;
  std::__cxx11::string::string((string *)local_40);
  uVar3 = std::__cxx11::string::length();
  if (3 < uVar3) {
    pcVar4 = (char *)std::__cxx11::string::operator[](tmp.field_2._8_8_);
    if (*pcVar4 == ':') {
      pcVar4 = (char *)std::__cxx11::string::operator[](tmp.field_2._8_8_);
      if (*pcVar4 != '\\') {
        pcVar4 = (char *)std::__cxx11::string::operator[](tmp.field_2._8_8_);
        if (*pcVar4 != '/') {
          pcVar4 = (char *)std::__cxx11::string::operator[](tmp.field_2._8_8_);
          __lhs = *pcVar4;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_a0,":\\",&local_a1);
          std::__cxx11::string::substr((ulong)&local_d8,tmp.field_2._8_8_);
          std::operator+(&local_80,&local_a0,&local_d8);
          std::operator+(&local_60,__lhs,&local_80);
          std::__cxx11::string::operator=((string *)local_40,(string *)&local_60);
          std::__cxx11::string::~string((string *)&local_60);
          std::__cxx11::string::~string((string *)&local_80);
          std::__cxx11::string::~string((string *)&local_d8);
          std::__cxx11::string::~string((string *)&local_a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_a1);
          goto LAB_006bf370;
        }
      }
    }
  }
  std::__cxx11::string::operator=((string *)local_40,(string *)tmp.field_2._8_8_);
LAB_006bf370:
  bVar1 = IOSystem::Exists(this->io,(string *)local_40);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)tmp.field_2._8_8_);
    test.field_2._12_4_ = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_120,"..",&local_121);
    iVar2 = (*this->io->_vptr_IOSystem[3])();
    std::operator+(&local_148,(char)iVar2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                   &local_120,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    bVar1 = IOSystem::Exists(this->io,(string *)local_100);
    if (bVar1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_100);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_188,"..",&local_189);
      iVar2 = (*this->io->_vptr_IOSystem[3])();
      std::operator+(&local_1b0,(char)iVar2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100)
      ;
      std::operator+(&local_168,&local_188,&local_1b0);
      std::__cxx11::string::operator=((string *)local_100,(string *)&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_188);
      std::allocator<char>::~allocator((allocator<char> *)&local_189);
      bVar1 = IOSystem::Exists(this->io,(string *)local_100);
      if (bVar1) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_100);
      }
      else {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_40);
      }
    }
    test.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_100);
  }
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string LWSImporter::FindLWOFile(const std::string& in)
{
    // insert missing directory separator if necessary
    std::string tmp;
    if (in.length() > 3 && in[1] == ':'&& in[2] != '\\' && in[2] != '/')
    {
        tmp = in[0] + (std::string(":\\") + in.substr(2));
    }
    else tmp = in;

    if (io->Exists(tmp)) {
        return in;
    }

    // file is not accessible for us ... maybe it's packed by
    // LightWave's 'Package Scene' command?

    // Relevant for us are the following two directories:
    // <folder>\Objects\<hh>\<*>.lwo
    // <folder>\Scenes\<hh>\<*>.lws
    // where <hh> is optional.

    std::string test = std::string("..") + (io->getOsSeparator() + tmp);
    if (io->Exists(test)) {
        return test;
    }

    test = std::string("..") + (io->getOsSeparator() + test);
    if (io->Exists(test)) {
        return test;
    }


    // return original path, maybe the IOsystem knows better
    return tmp;
}